

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O1

int mm_read_banner(FILE *f,MM_typecode *matcode)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  __int32_t **pp_Var4;
  char cVar5;
  int iVar6;
  char storage_scheme [64];
  char crd [64];
  char data_type [64];
  char mtx [64];
  char banner [64];
  char line [1025];
  char local_558;
  undefined6 uStack_557;
  undefined1 uStack_551;
  short local_550;
  undefined5 uStack_54e;
  char local_518;
  undefined2 uStack_517;
  undefined1 uStack_515;
  short sStack_514;
  undefined2 uStack_512;
  undefined3 uStack_510;
  undefined4 local_4d8;
  undefined4 uStack_4d4;
  char local_498;
  undefined2 uStack_497;
  int iStack_495;
  undefined6 local_458;
  undefined2 uStack_452;
  undefined6 uStack_450;
  char local_418 [1032];
  
  *matcode = (MM_typecode)0x47202020;
  pcVar3 = fgets(local_418,0x401,(FILE *)f);
  iVar6 = 0xc;
  if ((pcVar3 != (char *)0x0) &&
     (iVar2 = __isoc99_sscanf(local_418,"%s %s %s %s %s",&local_458,&local_498,&local_518,&local_4d8
                              ,&local_558), cVar5 = local_498, iVar2 == 5)) {
    if (local_498 != '\0') {
      pp_Var4 = __ctype_tolower_loc();
      pcVar3 = (char *)&uStack_497;
      do {
        pcVar3[-1] = (char)(*pp_Var4)[cVar5];
        cVar5 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar5 != '\0');
    }
    cVar5 = local_518;
    if (local_518 != '\0') {
      pp_Var4 = __ctype_tolower_loc();
      pcVar3 = (char *)&uStack_517;
      do {
        pcVar3[-1] = (char)(*pp_Var4)[cVar5];
        cVar5 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar5 != '\0');
    }
    cVar5 = (char)local_4d8;
    if ((char)local_4d8 != '\0') {
      pp_Var4 = __ctype_tolower_loc();
      pcVar3 = (char *)((long)&local_4d8 + 1);
      do {
        pcVar3[-1] = (char)(*pp_Var4)[cVar5];
        cVar5 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar5 != '\0');
    }
    cVar5 = local_558;
    if (local_558 != '\0') {
      pp_Var4 = __ctype_tolower_loc();
      pcVar3 = (char *)&uStack_557;
      do {
        pcVar3[-1] = (char)(*pp_Var4)[cVar5];
        cVar5 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (cVar5 != '\0');
    }
    iVar6 = 0xe;
    if (CONCAT62(uStack_450,uStack_452) == 0x74656b72614d7869 &&
        CONCAT26(uStack_452,local_458) == 0x78697274614d2525) {
      iVar6 = 0xf;
      if (iStack_495 == 0x786972 &&
          CONCAT13((undefined1)iStack_495,CONCAT21(uStack_497,local_498)) == 0x7274616d) {
        (*matcode)[0] = 'M';
        if (CONCAT35(uStack_510,CONCAT23(uStack_512,CONCAT21(sStack_514,uStack_515))) ==
            0x6574616e696472 &&
            CONCAT26(uStack_512,
                     CONCAT24(sStack_514,CONCAT13(uStack_515,CONCAT21(uStack_517,local_518)))) ==
            0x616e6964726f6f63) {
          cVar5 = 'C';
        }
        else {
          if (sStack_514 != 0x79 ||
              CONCAT13(uStack_515,CONCAT21(uStack_517,local_518)) != 0x61727261) {
            return 0xf;
          }
          cVar5 = 'A';
        }
        (*matcode)[1] = cVar5;
        if ((char)uStack_4d4 == '\0' && local_4d8 == 0x6c616572) {
          cVar5 = 'R';
        }
        else {
          lVar1 = CONCAT44(uStack_4d4,local_4d8);
          if (lVar1 == 0x78656c706d6f63) {
            cVar5 = 'C';
          }
          else if (lVar1 == 0x72656765746e69) {
            cVar5 = 'I';
          }
          else {
            if (lVar1 != 0x6e726574746170) {
              return 0xf;
            }
            cVar5 = 'P';
          }
        }
        (*matcode)[2] = cVar5;
        cVar5 = 'G';
        if (CONCAT17(uStack_551,CONCAT61(uStack_557,local_558)) != 0x6c6172656e6567) {
          if (local_550 == 99 &&
              CONCAT17(uStack_551,CONCAT61(uStack_557,local_558)) == 0x697274656d6d7973) {
            cVar5 = 'S';
          }
          else if (local_550 == 0x6e &&
                   CONCAT17(uStack_551,CONCAT61(uStack_557,local_558)) == 0x616974696d726568) {
            cVar5 = 'H';
          }
          else {
            if (CONCAT53(uStack_54e,CONCAT21(local_550,uStack_551)) != 0x63697274656d6d ||
                CONCAT17(uStack_551,CONCAT61(uStack_557,local_558)) != 0x6d79732d77656b73) {
              return 0xf;
            }
            cVar5 = 'K';
          }
        }
        (*matcode)[3] = cVar5;
        iVar6 = 0;
      }
    }
  }
  return iVar6;
}

Assistant:

int mm_read_banner(FILE *f, MM_typecode *matcode) {
    char line[MM_MAX_LINE_LENGTH];
    char banner[MM_MAX_TOKEN_LENGTH];
    char mtx[MM_MAX_TOKEN_LENGTH];
    char crd[MM_MAX_TOKEN_LENGTH];
    char data_type[MM_MAX_TOKEN_LENGTH];
    char storage_scheme[MM_MAX_TOKEN_LENGTH];
    char *p;


    mm_clear_typecode(matcode);

    if (fgets(line, MM_MAX_LINE_LENGTH, f) == NULL)
        return MM_PREMATURE_EOF;

    if (sscanf(line, "%s %s %s %s %s", banner, mtx, crd, data_type,
               storage_scheme) != 5)
        return MM_PREMATURE_EOF;

    for (p = mtx; *p != '\0'; *p = tolower(*p), p++);  /* convert to lower case */
    for (p = crd; *p != '\0'; *p = tolower(*p), p++);
    for (p = data_type; *p != '\0'; *p = tolower(*p), p++);
    for (p = storage_scheme; *p != '\0'; *p = tolower(*p), p++);

    /* check for banner */
    if (strncmp(banner, MatrixMarketBanner, strlen(MatrixMarketBanner)) != 0)
        return MM_NO_HEADER;

    /* first field should be "mtx" */
    if (strcmp(mtx, MM_MTX_STR) != 0)
        return MM_UNSUPPORTED_TYPE;
    mm_set_matrix(matcode);


    /* second field describes whether this is a sparse matrix (in coordinate
            storgae) or a dense array */


    if (strcmp(crd, MM_SPARSE_STR) == 0)
        mm_set_sparse(matcode);
    else if (strcmp(crd, MM_DENSE_STR) == 0)
        mm_set_dense(matcode);
    else
        return MM_UNSUPPORTED_TYPE;


    /* third field */

    if (strcmp(data_type, MM_REAL_STR) == 0)
        mm_set_real(matcode);
    else if (strcmp(data_type, MM_COMPLEX_STR) == 0)
        mm_set_complex(matcode);
    else if (strcmp(data_type, MM_PATTERN_STR) == 0)
        mm_set_pattern(matcode);
    else if (strcmp(data_type, MM_INT_STR) == 0)
        mm_set_integer(matcode);
    else
        return MM_UNSUPPORTED_TYPE;


    /* fourth field */

    if (strcmp(storage_scheme, MM_GENERAL_STR) == 0)
        mm_set_general(matcode);
    else if (strcmp(storage_scheme, MM_SYMM_STR) == 0)
        mm_set_symmetric(matcode);
    else if (strcmp(storage_scheme, MM_HERM_STR) == 0)
        mm_set_hermitian(matcode);
    else if (strcmp(storage_scheme, MM_SKEW_STR) == 0)
        mm_set_skew(matcode);
    else
        return MM_UNSUPPORTED_TYPE;


    return 0;
}